

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O0

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ArgMinMaxNState<duckdb::MinMaxStringValue,_duckdb::MinMaxFixedValue<int>,_duckdb::LessThan> *this;
  unsigned_long **ppuVar1;
  undefined1 uVar2;
  ArgMinMaxNState<duckdb::MinMaxStringValue,_duckdb::MinMaxFixedValue<int>,_duckdb::LessThan>
  **ppAVar3;
  idx_t iVar4;
  list_entry_t *plVar5;
  UnifiedVectorFormat *pUVar6;
  idx_t iVar7;
  STORAGE_TYPE *pSVar8;
  TYPE *pTVar9;
  UnifiedVectorFormat *in_RCX;
  Vector *in_RDX;
  ulong in_RDI;
  long in_R8;
  idx_t slot;
  STORAGE_TYPE *heap;
  list_entry_t *list_entry;
  ArgMinMaxNState<duckdb::MinMaxStringValue,_duckdb::MinMaxFixedValue<int>,_duckdb::LessThan>
  *state_1;
  idx_t state_idx_1;
  idx_t rid;
  idx_t i_1;
  idx_t current_offset;
  Vector *child_data;
  list_entry_t *list_entries;
  ArgMinMaxNState<duckdb::MinMaxStringValue,_duckdb::MinMaxFixedValue<int>,_duckdb::LessThan> *state
  ;
  idx_t state_idx;
  idx_t i;
  idx_t new_entries;
  idx_t old_len;
  ValidityMask *mask;
  ArgMinMaxNState<duckdb::MinMaxStringValue,_duckdb::MinMaxFixedValue<int>,_duckdb::LessThan>
  **states;
  UnifiedVectorFormat state_format;
  idx_t in_stack_fffffffffffffe98;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffea0;
  TYPE *value;
  STORAGE_TYPE *idx;
  undefined7 in_stack_fffffffffffffec0;
  TYPE *local_108;
  UnifiedVectorFormat *local_d8;
  TemplatedValidityMask<unsigned_long> *local_d0;
  UnifiedVectorFormat *local_a8;
  long local_a0;
  SelectionVector *local_70 [9];
  long local_28;
  UnifiedVectorFormat *local_20;
  Vector *local_18;
  ulong local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_70);
  duckdb::Vector::ToUnifiedFormat(local_8,local_20);
  ppAVar3 = UnifiedVectorFormat::
            GetData<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxFixedValue<int>,duckdb::LessThan>*>
                      ((UnifiedVectorFormat *)local_70);
  FlatVector::Validity((Vector *)0x89edcb);
  local_d0 = (TemplatedValidityMask<unsigned_long> *)duckdb::ListVector::GetListSize(local_18);
  local_a0 = 0;
  for (local_a8 = (UnifiedVectorFormat *)0x0; local_a8 < local_20; local_a8 = local_a8 + 1) {
    iVar4 = SelectionVector::get_index(local_70[0],(idx_t)local_a8);
    iVar4 = BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::LessThan>::Size
                      (&ppAVar3[iVar4]->heap);
    local_a0 = iVar4 + local_a0;
  }
  duckdb::ListVector::Reserve(local_18,(long)&local_d0->validity_mask + local_a0);
  plVar5 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x89eef2);
  iVar4 = duckdb::ListVector::GetEntry(local_18);
  for (local_d8 = (UnifiedVectorFormat *)0x0; local_d8 < local_20; local_d8 = local_d8 + 1) {
    pUVar6 = local_d8 + local_28;
    iVar7 = SelectionVector::get_index(local_70[0],(idx_t)local_d8);
    this = ppAVar3[iVar7];
    if (((this->is_initialized & 1U) == 0) ||
       (uVar2 = BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::LessThan>::IsEmpty(&this->heap),
       (bool)uVar2)) {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    }
    else {
      plVar5[(long)pUVar6].offset = (uint64_t)local_d0;
      iVar7 = BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::LessThan>::Size(&this->heap);
      plVar5[(long)pUVar6].length = iVar7;
      pSVar8 = BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::LessThan>::SortAndGetHeap
                         ((BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::LessThan> *)
                          in_stack_fffffffffffffea0);
      local_108 = (TYPE *)0x0;
      idx = pSVar8;
      while (value = local_108,
            pTVar9 = (TYPE *)BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::LessThan>::Size
                                       (&this->heap), value < pTVar9) {
        ppuVar1 = &local_d0->validity_mask;
        in_stack_fffffffffffffe98 = iVar4;
        BinaryAggregateHeap<int,_duckdb::string_t,_duckdb::LessThan>::GetValue
                  (pSVar8 + (long)local_108);
        MinMaxStringValue::Assign
                  ((Vector *)CONCAT17(uVar2,in_stack_fffffffffffffec0),(idx_t)idx,value);
        local_108 = (TYPE *)((long)&local_108->value + 1);
        in_stack_fffffffffffffea0 = local_d0;
        local_d0 = (TemplatedValidityMask<unsigned_long> *)((long)ppuVar1 + 1);
      }
    }
  }
  duckdb::ListVector::SetListSize(local_18,(ulong)local_d0);
  duckdb::Vector::Verify((ulong)local_18);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffea0);
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}